

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusutil.cpp
# Opt level: O1

bool QDBusUtil::isValidSignature(QString *signature)

{
  char16_t *signature_00;
  char16_t *pcVar1;
  char16_t *pcVar2;
  long in_FS_OFFSET;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::toLatin1_helper(&local_38);
  pcVar2 = (char16_t *)(local_38.d.size + (long)local_38.d.ptr);
  pcVar1 = local_38.d.ptr;
  do {
    signature_00 = pcVar1;
    if (signature_00 == pcVar2) break;
    pcVar1 = (char16_t *)validateSingleType((char *)signature_00);
  } while (pcVar1 != (char16_t *)0x0);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return signature_00 == pcVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool isValidSignature(const QString &signature)
    {
        QByteArray ba = signature.toLatin1();
        const char *data = ba.constBegin();
        const char *end = ba.constEnd();
        while (data != end) {
            data = validateSingleType(data);
            if (!data)
                return false;
        }
        return true;
    }